

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

_Bool amqpvalue_are_equal(AMQP_VALUE value1,AMQP_VALUE value2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  _Bool _Var7;
  int iVar8;
  LOGGER_LOG p_Var9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  bool local_51;
  uint local_44;
  uint local_40;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  AMQP_VALUE_DATA *value2_data;
  AMQP_VALUE_DATA *value1_data;
  LOGGER_LOG l;
  _Bool result;
  AMQP_VALUE value2_local;
  AMQP_VALUE value1_local;
  
  if ((value1 == (AMQP_VALUE)0x0) && (value2 == (AMQP_VALUE)0x0)) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      (*p_Var9)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_are_equal",0x7f3,1,"Bad arguments: value1 = %p, value2 = %p",0,0);
    }
    l._7_1_ = true;
  }
  else if ((value1 == value2) || ((value1 != (AMQP_VALUE)0x0 && (value2 != (AMQP_VALUE)0x0)))) {
    if (value1->type == value2->type) {
      switch(value1->type) {
      case AMQP_TYPE_NULL:
        l._7_1_ = true;
        break;
      case AMQP_TYPE_BOOL:
        l._7_1_ = ((value1->value).ubyte_value & 1) == ((value2->value).ubyte_value & 1);
        break;
      case AMQP_TYPE_UBYTE:
        l._7_1_ = (value1->value).ubyte_value == (value2->value).ubyte_value;
        break;
      case AMQP_TYPE_USHORT:
        l._7_1_ = (value1->value).ushort_value == (value2->value).ushort_value;
        break;
      case AMQP_TYPE_UINT:
        l._7_1_ = (value1->value).uint_value == (value2->value).uint_value;
        break;
      case AMQP_TYPE_ULONG:
        l._7_1_ = (value1->value).described_value.descriptor ==
                  (value2->value).described_value.descriptor;
        break;
      case AMQP_TYPE_BYTE:
        l._7_1_ = (value1->value).ubyte_value == (value2->value).ubyte_value;
        break;
      case AMQP_TYPE_SHORT:
        l._7_1_ = (value1->value).ushort_value == (value2->value).ushort_value;
        break;
      case AMQP_TYPE_INT:
        l._7_1_ = (value1->value).uint_value == (value2->value).uint_value;
        break;
      case AMQP_TYPE_LONG:
        l._7_1_ = (value1->value).described_value.descriptor ==
                  (value2->value).described_value.descriptor;
        break;
      case AMQP_TYPE_FLOAT:
        l._7_1_ = (value1->value).float_value == (value2->value).float_value;
        break;
      case AMQP_TYPE_DOUBLE:
        l._7_1_ = (value1->value).double_value == (value2->value).double_value;
        break;
      case AMQP_TYPE_CHAR:
        l._7_1_ = (value1->value).uint_value == (value2->value).uint_value;
        break;
      case AMQP_TYPE_TIMESTAMP:
        l._7_1_ = (value1->value).described_value.descriptor ==
                  (value2->value).described_value.descriptor;
        break;
      case AMQP_TYPE_UUID:
        cVar10 = -((value1->value).ubyte_value == (value2->value).ubyte_value);
        cVar11 = -((value1->value).uuid_value[1] == (value2->value).uuid_value[1]);
        cVar12 = -((value1->value).uuid_value[2] == (value2->value).uuid_value[2]);
        cVar13 = -((value1->value).uuid_value[3] == (value2->value).uuid_value[3]);
        cVar14 = -((value1->value).uuid_value[4] == (value2->value).uuid_value[4]);
        cVar15 = -((value1->value).uuid_value[5] == (value2->value).uuid_value[5]);
        cVar16 = -((value1->value).uuid_value[6] == (value2->value).uuid_value[6]);
        cVar17 = -((value1->value).uuid_value[7] == (value2->value).uuid_value[7]);
        cVar18 = -((value1->value).uuid_value[8] == (value2->value).uuid_value[8]);
        cVar19 = -((value1->value).uuid_value[9] == (value2->value).uuid_value[9]);
        cVar20 = -((value1->value).uuid_value[10] == (value2->value).uuid_value[10]);
        cVar21 = -((value1->value).uuid_value[0xb] == (value2->value).uuid_value[0xb]);
        cVar22 = -((value1->value).uuid_value[0xc] == (value2->value).uuid_value[0xc]);
        cVar23 = -((value1->value).uuid_value[0xd] == (value2->value).uuid_value[0xd]);
        cVar24 = -((value1->value).uuid_value[0xe] == (value2->value).uuid_value[0xe]);
        bVar25 = -((value1->value).uuid_value[0xf] == (value2->value).uuid_value[0xf]);
        auVar1[1] = cVar11;
        auVar1[0] = cVar10;
        auVar1[2] = cVar12;
        auVar1[3] = cVar13;
        auVar1[4] = cVar14;
        auVar1[5] = cVar15;
        auVar1[6] = cVar16;
        auVar1[7] = cVar17;
        auVar1[8] = cVar18;
        auVar1[9] = cVar19;
        auVar1[10] = cVar20;
        auVar1[0xb] = cVar21;
        auVar1[0xc] = cVar22;
        auVar1[0xd] = cVar23;
        auVar1[0xe] = cVar24;
        auVar1[0xf] = bVar25;
        auVar2[1] = cVar11;
        auVar2[0] = cVar10;
        auVar2[2] = cVar12;
        auVar2[3] = cVar13;
        auVar2[4] = cVar14;
        auVar2[5] = cVar15;
        auVar2[6] = cVar16;
        auVar2[7] = cVar17;
        auVar2[8] = cVar18;
        auVar2[9] = cVar19;
        auVar2[10] = cVar20;
        auVar2[0xb] = cVar21;
        auVar2[0xc] = cVar22;
        auVar2[0xd] = cVar23;
        auVar2[0xe] = cVar24;
        auVar2[0xf] = bVar25;
        auVar6[1] = cVar13;
        auVar6[0] = cVar12;
        auVar6[2] = cVar14;
        auVar6[3] = cVar15;
        auVar6[4] = cVar16;
        auVar6[5] = cVar17;
        auVar6[6] = cVar18;
        auVar6[7] = cVar19;
        auVar6[8] = cVar20;
        auVar6[9] = cVar21;
        auVar6[10] = cVar22;
        auVar6[0xb] = cVar23;
        auVar6[0xc] = cVar24;
        auVar6[0xd] = bVar25;
        auVar5[1] = cVar14;
        auVar5[0] = cVar13;
        auVar5[2] = cVar15;
        auVar5[3] = cVar16;
        auVar5[4] = cVar17;
        auVar5[5] = cVar18;
        auVar5[6] = cVar19;
        auVar5[7] = cVar20;
        auVar5[8] = cVar21;
        auVar5[9] = cVar22;
        auVar5[10] = cVar23;
        auVar5[0xb] = cVar24;
        auVar5[0xc] = bVar25;
        auVar4[1] = cVar15;
        auVar4[0] = cVar14;
        auVar4[2] = cVar16;
        auVar4[3] = cVar17;
        auVar4[4] = cVar18;
        auVar4[5] = cVar19;
        auVar4[6] = cVar20;
        auVar4[7] = cVar21;
        auVar4[8] = cVar22;
        auVar4[9] = cVar23;
        auVar4[10] = cVar24;
        auVar4[0xb] = bVar25;
        auVar3[1] = cVar16;
        auVar3[0] = cVar15;
        auVar3[2] = cVar17;
        auVar3[3] = cVar18;
        auVar3[4] = cVar19;
        auVar3[5] = cVar20;
        auVar3[6] = cVar21;
        auVar3[7] = cVar22;
        auVar3[8] = cVar23;
        auVar3[9] = cVar24;
        auVar3[10] = bVar25;
        l._7_1_ = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                           (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                           (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                           (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                           (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(
                                                  cVar22,CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(
                                                  cVar19,CONCAT12(cVar18,CONCAT11(cVar17,cVar16)))))
                                                  )))) >> 7) & 1) << 6 |
                           (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(
                                                  cVar22,CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(
                                                  cVar19,CONCAT11(cVar18,cVar17)))))))) >> 7) & 1)
                           << 7 | (ushort)(bVar25 >> 7) << 0xf) == 0xffff;
        break;
      case AMQP_TYPE_BINARY:
        local_51 = false;
        if ((value1->value).binary_value.length == (value2->value).binary_value.length) {
          iVar8 = memcmp((value1->value).binary_value.bytes,(value2->value).binary_value.bytes,
                         (ulong)(value1->value).binary_value.length);
          local_51 = iVar8 == 0;
        }
        l._7_1_ = local_51;
        break;
      case AMQP_TYPE_STRING:
        iVar8 = strcmp((char *)(value1->value).described_value.descriptor,
                       (char *)(value2->value).described_value.descriptor);
        l._7_1_ = iVar8 == 0;
        break;
      case AMQP_TYPE_SYMBOL:
        iVar8 = strcmp((char *)(value1->value).described_value.descriptor,
                       (char *)(value2->value).described_value.descriptor);
        l._7_1_ = iVar8 == 0;
        break;
      case AMQP_TYPE_LIST:
        if ((value1->value).binary_value.length == (value2->value).binary_value.length) {
          i_2 = 0;
          while ((i_2 < (value1->value).binary_value.length &&
                 (_Var7 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                               (&((value1->value).described_value.descriptor)->type
                                               + (ulong)i_2 * 2),
                                              *(AMQP_VALUE *)
                                               (&((value2->value).described_value.descriptor)->type
                                               + (ulong)i_2 * 2)), _Var7))) {
            i_2 = i_2 + 1;
          }
          l._7_1_ = i_2 == (value1->value).binary_value.length;
        }
        else {
          l._7_1_ = false;
        }
        break;
      case AMQP_TYPE_MAP:
        if ((value1->value).binary_value.length == (value2->value).binary_value.length) {
          local_44 = 0;
          while (((local_44 < (value1->value).binary_value.length &&
                  (_Var7 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                                (&((value1->value).described_value.descriptor)->type
                                                + (ulong)local_44 * 4),
                                               *(AMQP_VALUE *)
                                                (&((value2->value).described_value.descriptor)->type
                                                + (ulong)local_44 * 4)), _Var7)) &&
                 (_Var7 = amqpvalue_are_equal((&((value1->value).described_value.descriptor)->value)
                                              [local_44].described_value.descriptor,
                                              (&((value2->value).described_value.descriptor)->value)
                                              [local_44].described_value.descriptor), _Var7))) {
            local_44 = local_44 + 1;
          }
          l._7_1_ = local_44 == (value1->value).binary_value.length;
        }
        else {
          l._7_1_ = false;
        }
        break;
      case AMQP_TYPE_ARRAY:
        if ((value1->value).binary_value.length == (value2->value).binary_value.length) {
          local_40 = 0;
          while ((local_40 < (value1->value).binary_value.length &&
                 (_Var7 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                               (&((value1->value).described_value.descriptor)->type
                                               + (ulong)local_40 * 2),
                                              *(AMQP_VALUE *)
                                               (&((value2->value).described_value.descriptor)->type
                                               + (ulong)local_40 * 2)), _Var7))) {
            local_40 = local_40 + 1;
          }
          l._7_1_ = local_40 == (value1->value).binary_value.length;
        }
        else {
          l._7_1_ = false;
        }
        break;
      default:
        l._7_1_ = false;
      }
    }
    else {
      l._7_1_ = false;
    }
  }
  else {
    l._7_1_ = false;
  }
  return l._7_1_;
}

Assistant:

bool amqpvalue_are_equal(AMQP_VALUE value1, AMQP_VALUE value2)
{
    bool result;

    /* Codes_SRS_AMQPVALUE_01_207: [If value1 and value2 are NULL, amqpvalue_are_equal shall return true.] */
    if ((value1 == NULL) &&
        (value2 == NULL))
    {
        LogError("Bad arguments: value1 = %p, value2 = %p",
            value1, value2);
        result = true;
    }
    /* Codes_SRS_AMQPVALUE_01_208: [If one of the arguments is NULL and the other is not, amqpvalue_are_equal shall return false.] */
    else if ((value1 != value2) && ((value1 == NULL) || (value2 == NULL)))
    {
        result = false;
    }
    else
    {
        AMQP_VALUE_DATA* value1_data = (AMQP_VALUE_DATA*)value1;
        AMQP_VALUE_DATA* value2_data = (AMQP_VALUE_DATA*)value2;

        /* Codes_SRS_AMQPVALUE_01_209: [If the types for value1 and value2 are different amqpvalue_are_equal shall return false.] */
#if _MSC_VER
#pragma warning(suppress: 28182) /* The compiler states that value2_data can be NULL, but it cannot. And there are tests for it. */
#endif
        if (value1_data->type != value2_data->type)
        {
            result = false;
        }
        else
        {
            switch (value1_data->type)
            {
            default:
                result = false;
                break;

            case AMQP_TYPE_NULL:
                /* Codes_SRS_AMQPVALUE_01_210: [- null: always equal.] */
                result = true;
                break;

            case AMQP_TYPE_BOOL:
                /* Codes_SRS_AMQPVALUE_01_211: [- boolean: compare the bool content.] */
                result = (value1_data->value.bool_value == value2_data->value.bool_value);
                break;

            case AMQP_TYPE_UBYTE:
                /* Codes_SRS_AMQPVALUE_01_212: [- ubyte: compare the unsigned char content.] */
                result = (value1_data->value.ubyte_value == value2_data->value.ubyte_value);
                break;

            case AMQP_TYPE_USHORT:
                /* Codes_SRS_AMQPVALUE_01_213: [- ushort: compare the uint16_t content.] */
                result = (value1_data->value.ushort_value == value2_data->value.ushort_value);
                break;

            case AMQP_TYPE_UINT:
                /* Codes_SRS_AMQPVALUE_01_214: [- uint: compare the uint32_t content.] */
                result = (value1_data->value.uint_value == value2_data->value.uint_value);
                break;

            case AMQP_TYPE_ULONG:
                /* Codes_SRS_AMQPVALUE_01_215: [- ulong: compare the uint64_t content.] */
                result = (value1_data->value.ulong_value == value2_data->value.ulong_value);
                break;

            case AMQP_TYPE_BYTE:
                /* Codes_SRS_AMQPVALUE_01_216: [- byte: compare the char content.] */
                result = (value1_data->value.byte_value == value2_data->value.byte_value);
                break;

            case AMQP_TYPE_SHORT:
                /* Codes_SRS_AMQPVALUE_01_217: [- short: compare the int16_t content.] */
                result = (value1_data->value.short_value == value2_data->value.short_value);
                break;

            case AMQP_TYPE_INT:
                /* Codes_SRS_AMQPVALUE_01_218: [- int: compare the int32_t content.] */
                result = (value1_data->value.int_value == value2_data->value.int_value);
                break;

            case AMQP_TYPE_LONG:
                /* Codes_SRS_AMQPVALUE_01_219: [- long: compare the int64_t content.] */
                result = (value1_data->value.long_value == value2_data->value.long_value);
                break;

            case AMQP_TYPE_FLOAT:
                /* Codes_SRS_AMQPVALUE_01_224: [- float: compare the float content.] */
                result = (value1_data->value.float_value == value2_data->value.float_value);
                break;

            case AMQP_TYPE_DOUBLE:
                /* Codes_SRS_AMQPVALUE_01_225: [- double: compare the double content.] */
                result = (value1_data->value.double_value == value2_data->value.double_value);
                break;

            case AMQP_TYPE_CHAR:
                /* Codes_SRS_AMQPVALUE_01_226: [- char: compare the UNICODE character.] */
                result = (value1_data->value.char_value == value2_data->value.char_value);
                break;

            case AMQP_TYPE_TIMESTAMP:
                /* Codes_SRS_AMQPVALUE_01_227: [- timestamp: compare the underlying 64 bit integer.] */
                result = (value1_data->value.timestamp_value == value2_data->value.timestamp_value);
                break;

            case AMQP_TYPE_UUID:
                /* Codes_SRS_AMQPVALUE_01_228: [- uuid: compare all uuid bytes.] */
                result = (memcmp(value1_data->value.uuid_value, value2_data->value.uuid_value, sizeof(value1_data->value.uuid_value)) == 0);
                break;

            case AMQP_TYPE_BINARY:
                /* Codes_SRS_AMQPVALUE_01_229: [- binary: compare all binary bytes.] */
                result = (value1_data->value.binary_value.length == value2_data->value.binary_value.length) &&
                    (memcmp(value1_data->value.binary_value.bytes, value2_data->value.binary_value.bytes, value1_data->value.binary_value.length) == 0);
                break;

            case AMQP_TYPE_STRING:
                /* Codes_SRS_AMQPVALUE_01_230: [- string: compare all string characters.] */
                result = (strcmp(value1_data->value.string_value.chars, value2_data->value.string_value.chars) == 0);
                break;

            case AMQP_TYPE_SYMBOL:
                /* Codes_SRS_AMQPVALUE_01_263: [- symbol: compare all symbol characters.] */
                result = (strcmp(value1_data->value.symbol_value.chars, value2_data->value.symbol_value.chars) == 0);
                break;

            case AMQP_TYPE_LIST:
            {
                /* Codes_SRS_AMQPVALUE_01_231: [- list: compare list item count and each element.] */
                if (value1_data->value.list_value.count != value2_data->value.list_value.count)
                {
                    result = false;
                }
                else
                {
                    uint32_t i;

                    for (i = 0; i < value1_data->value.list_value.count; i++)
                    {
                        /* Codes_SRS_AMQPVALUE_01_232: [Nesting shall be considered in comparison.] */
                        if (!amqpvalue_are_equal(value1_data->value.list_value.items[i], value2_data->value.list_value.items[i]))
                        {
                            break;
                        }
                    }

                    result = (i == value1_data->value.list_value.count);
                }

                break;
            }
            case AMQP_TYPE_ARRAY:
            {
                /* Codes_SRS_AMQPVALUE_01_427: [- array: compare array item count and each element. ] */
                if (value1_data->value.array_value.count != value2_data->value.array_value.count)
                {
                    result = false;
                }
                else
                {
                    uint32_t i;

                    for (i = 0; i < value1_data->value.array_value.count; i++)
                    {
                        /* Codes_SRS_AMQPVALUE_01_428: [ Nesting shall be considered in comparison. ] */
                        if (!amqpvalue_are_equal(value1_data->value.array_value.items[i], value2_data->value.array_value.items[i]))
                        {
                            break;
                        }
                    }

                    result = (i == value1_data->value.array_value.count);
                }

                break;
            }
            case AMQP_TYPE_MAP:
            {
                /* Codes_SRS_AMQPVALUE_01_233: [- map: compare map pair count and each key/value pair.] */
                if (value1_data->value.map_value.pair_count != value2_data->value.map_value.pair_count)
                {
                    result = false;
                }
                else
                {
                    uint32_t i;

                    /* Codes_SRS_AMQPVALUE_01_126: [Unless known to be otherwise, maps MUST be considered to be ordered, that is, the order of the key-value pairs is semantically important and two maps which are different only in the order in which their key-value pairs are encoded are not equal.] */
                    for (i = 0; i < value1_data->value.map_value.pair_count; i++)
                    {
                        /* Codes_SRS_AMQPVALUE_01_234: [Nesting shall be considered in comparison.] */
                        if ((!amqpvalue_are_equal(value1_data->value.map_value.pairs[i].key, value2_data->value.map_value.pairs[i].key)) ||
                            (!amqpvalue_are_equal(value1_data->value.map_value.pairs[i].value, value2_data->value.map_value.pairs[i].value)))
                        {
                            break;
                        }
                    }

                    result = (i == value1_data->value.map_value.pair_count);
                }

                break;
            }
            }
        }
    }

    return result;
}